

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O1

void __thiscall QProgressDialog::setLabel(QProgressDialog *this,QLabel *label)

{
  QProgressDialogPrivate *this_00;
  QLabel *pQVar1;
  
  this_00 = *(QProgressDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  pQVar1 = this_00->label;
  if (pQVar1 != label) {
    if (pQVar1 != (QLabel *)0x0) {
      (**(code **)(*(long *)&(pQVar1->super_QFrame).super_QWidget + 0x20))();
    }
    this_00->label = label;
    QProgressDialogPrivate::adoptChildWidget(this_00,(QWidget *)label);
    return;
  }
  if (label != (QLabel *)0x0) {
    setLabel();
  }
  return;
}

Assistant:

void QProgressDialog::setLabel(QLabel *label)
{
    Q_D(QProgressDialog);
    if (label == d->label) {
        if (Q_UNLIKELY(label))
            qWarning("QProgressDialog::setLabel: Attempt to set the same label again");
        return;
    }
    delete d->label;
    d->label = label;
    d->adoptChildWidget(label);
}